

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

void __thiscall QDomNamedNodeMapPrivate::clearMap(QDomNamedNodeMapPrivate *this)

{
  QAtomicInt *pQVar1;
  long in_FS_OFFSET;
  const_iterator local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->appendToParent == false) {
    local_38.e = (Chain **)&DAT_aaaaaaaaaaaaaaaa;
    local_38.i.d = (Data<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *)
                   &DAT_aaaaaaaaaaaaaaaa;
    local_38.i.bucket = (size_t)&DAT_aaaaaaaaaaaaaaaa;
    QMultiHash<QString,_QDomNodePrivate_*>::constBegin(&local_38,&this->map);
    while (local_38.e != (Chain **)0x0) {
      LOCK();
      pQVar1 = &(*local_38.e)->value->ref;
      (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i =
           (pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((pQVar1->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i == 0) && ((*local_38.e)->value != (QDomNodePrivate *)0x0))
      {
        (*(*local_38.e)->value->_vptr_QDomNodePrivate[1])();
      }
      QMultiHash<QString,_QDomNodePrivate_*>::const_iterator::operator++(&local_38);
    }
  }
  QMultiHash<QString,_QDomNodePrivate_*>::clear(&this->map);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDomNamedNodeMapPrivate::clearMap()
{
    // Dereference all of our children if we took references
    if (!appendToParent) {
        auto it = map.constBegin();
        for (; it != map.constEnd(); ++it)
            if (!it.value()->ref.deref())
                delete it.value();
    }
    map.clear();
}